

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MES.cpp
# Opt level: O1

void * MESThread(void *pParam)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  char *pcVar13;
  double distance;
  CHRONO chrono_period;
  char szTemp [256];
  MES mes;
  char szSaveFilePath [256];
  timespec local_7e0;
  int local_7d0;
  int local_7cc;
  double local_7c8;
  timespec local_7c0;
  long local_7b0;
  long lStack_7a8;
  long local_7a0;
  long lStack_798;
  timespec local_790;
  int local_780;
  char local_778 [264];
  MES local_670;
  char local_138 [264];
  
  local_7c8 = 0.0;
  memset(&local_670,0,0x538);
  iVar3 = clock_getres(4,&local_790);
  if ((iVar3 == 0) && (iVar3 = clock_gettime(4,&local_7c0), iVar3 == 0)) {
    local_780 = 0;
    local_7b0 = 0;
    lStack_7a8 = 0;
    local_7a0 = 0;
    lStack_798 = 0;
  }
  iVar3 = 100;
  bVar1 = false;
  local_7d0 = 0;
  do {
    local_7cc = iVar3;
    while( true ) {
      if (local_780 == 0) {
        clock_gettime(4,&local_7e0);
        local_7b0 = local_7e0.tv_sec;
        lStack_7a8 = local_7e0.tv_nsec;
        local_7e0.tv_sec =
             (local_7e0.tv_sec + local_7a0 + (local_7e0.tv_nsec + lStack_798) / 1000000000) -
             local_7c0.tv_sec;
        local_7e0.tv_nsec = (local_7e0.tv_nsec + lStack_798) % 1000000000 - local_7c0.tv_nsec;
        if (local_7e0.tv_nsec < 0) {
          local_7e0.tv_sec = local_7e0.tv_sec + local_7e0.tv_nsec / 1000000000 + -1;
          local_7e0.tv_nsec = local_7e0.tv_nsec % 1000000000 + 1000000000;
        }
        local_7a0 = local_7e0.tv_sec;
        lStack_798 = local_7e0.tv_nsec;
      }
      iVar4 = clock_getres(4,&local_790);
      if ((iVar4 == 0) && (iVar4 = clock_gettime(4,&local_7c0), iVar4 == 0)) {
        local_780 = 0;
        local_7a0 = 0;
        lStack_798 = 0;
        local_7b0 = 0;
        lStack_7a8 = 0;
      }
      local_7e0.tv_sec = (long)iVar3 / 1000;
      local_7e0.tv_nsec = ((long)iVar3 % 1000) * 1000000;
      nanosleep(&local_7e0,(timespec *)0x0);
      iVar4 = local_7cc;
      if (bPauseMES == 0) break;
      if (bVar1) {
        puts("MES paused.");
        iVar4 = CloseRS232Port(&local_670.RS232Port);
        pcVar13 = "MES disconnection failed.";
        if (iVar4 == 0) {
          pcVar13 = "MES disconnected.";
        }
        puts(pcVar13);
      }
      if (bExit != 0) {
        bVar2 = true;
        goto LAB_001c205e;
      }
      local_7e0.tv_sec = 0;
      local_7e0.tv_nsec = 100000000;
      bVar1 = false;
      nanosleep(&local_7e0,(timespec *)0x0);
    }
    if (bRestartMES != 0) {
      if (bVar1) {
        puts("Restarting a MES.");
        iVar3 = CloseRS232Port(&local_670.RS232Port);
        pcVar13 = "MES disconnection failed.";
        if (iVar3 == 0) {
          pcVar13 = "MES disconnected.";
        }
        puts(pcVar13);
      }
      bRestartMES = 0;
      bVar1 = false;
    }
    if (bVar1) {
      iVar3 = GetLatestDataMES(&local_670,&local_7c8);
      if (iVar3 == 0) {
        pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
        altitude_AGL = local_7c8;
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        bVar1 = true;
        bVar2 = false;
        iVar3 = iVar4;
      }
      else {
        puts("Connection to a MES lost.");
        iVar3 = CloseRS232Port(&local_670.RS232Port);
        if (iVar3 == 0) {
          pcVar13 = "MES disconnected.";
        }
        else {
          pcVar13 = "MES disconnection failed.";
        }
        puts(pcVar13);
LAB_001c1eae:
        bVar1 = false;
        bVar2 = true;
        iVar3 = iVar4;
      }
    }
    else {
      iVar5 = ConnectMES(&local_670,"MES0.txt");
      iVar3 = local_670.threadperiod;
      if (iVar5 != 0) {
        local_7e0.tv_sec = 1;
        local_7e0.tv_nsec = 0;
        nanosleep(&local_7e0,(timespec *)0x0);
        goto LAB_001c1eae;
      }
      if ((FILE *)local_670.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)local_670.pfSaveFile);
        local_670.pfSaveFile = (FILE *)0x0;
      }
      bVar2 = false;
      bVar1 = true;
      if ((local_670.bSaveRawData != 0) && ((FILE *)local_670.pfSaveFile == (FILE *)0x0)) {
        if (local_670.szCfgFilePath[0] == '\0') {
          builtin_strncpy(local_778,"mes",4);
        }
        else {
          sprintf(local_778,"%.127s",local_670.szCfgFilePath);
        }
        sVar7 = strlen(local_778);
        uVar6 = (uint)sVar7;
        uVar12 = sVar7 & 0xffffffff;
        uVar8 = (int)uVar6 >> 0x1f & uVar6;
        uVar11 = sVar7 & 0xffffffff;
        do {
          uVar12 = uVar12 - 1;
          uVar10 = (uint)uVar11;
          uVar11 = (ulong)(uVar8 - 1);
          uVar9 = uVar8;
          if ((int)uVar10 < 1) break;
          uVar11 = (ulong)(uVar10 - 1);
          uVar9 = uVar10;
        } while (local_778[uVar12 & 0xffffffff] != '.');
        if ((int)uVar9 <= (int)uVar6 && 1 < (int)uVar9) {
          memset(local_778 + uVar11,0,sVar7 - uVar11);
        }
        pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
        pcVar13 = strtimeex_fns();
        sprintf(local_138,"log/%.127s_%.64s.txt",local_778,pcVar13);
        pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
        bVar2 = false;
        local_670.pfSaveFile = (FILE *)fopen(local_138,"wb");
        if ((FILE *)local_670.pfSaveFile == (FILE *)0x0) {
          puts("Unable to create MES data file.");
          bVar2 = false;
          goto LAB_001c205e;
        }
      }
    }
    if ((bVar2) &&
       (local_7d0 = local_7d0 + 1, ExitOnErrorCount <= local_7d0 && 0 < ExitOnErrorCount)) {
      bExit = 1;
    }
    if (bExit != 0) {
LAB_001c205e:
      if (local_780 == 0) {
        clock_gettime(4,&local_7e0);
        local_7b0 = local_7e0.tv_sec;
        lStack_7a8 = local_7e0.tv_nsec;
        local_7e0.tv_sec =
             (local_7e0.tv_sec + local_7a0 + (local_7e0.tv_nsec + lStack_798) / 1000000000) -
             local_7c0.tv_sec;
        local_7e0.tv_nsec = (local_7e0.tv_nsec + lStack_798) % 1000000000 - local_7c0.tv_nsec;
        if (local_7e0.tv_nsec < 0) {
          local_7e0.tv_sec = local_7e0.tv_sec + local_7e0.tv_nsec / 1000000000 + -1;
          local_7e0.tv_nsec = local_7e0.tv_nsec % 1000000000 + 1000000000;
        }
        local_7a0 = local_7e0.tv_sec;
        lStack_798 = local_7e0.tv_nsec;
      }
      if ((FILE *)local_670.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)local_670.pfSaveFile);
        local_670.pfSaveFile = (FILE *)0x0;
      }
      if (!bVar2) {
        iVar3 = CloseRS232Port(&local_670.RS232Port);
        pcVar13 = "MES disconnection failed.";
        if (iVar3 == 0) {
          pcVar13 = "MES disconnected.";
        }
        puts(pcVar13);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE MESThread(void* pParam)
{
	MES mes;
	double distance = 0;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 100;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&mes, 0, sizeof(MES));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPauseMES)
		{
			if (bConnected)
			{
				printf("MES paused.\n");
				bConnected = FALSE;
				DisconnectMES(&mes);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartMES)
		{
			if (bConnected)
			{
				printf("Restarting a MES.\n");
				bConnected = FALSE;
				DisconnectMES(&mes);
			}
			bRestartMES = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectMES(&mes, "MES0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = mes.threadperiod;

				if (mes.pfSaveFile != NULL)
				{
					fclose(mes.pfSaveFile); 
					mes.pfSaveFile = NULL;
				}
				if ((mes.bSaveRawData)&&(mes.pfSaveFile == NULL)) 
				{
					if (strlen(mes.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", mes.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "mes");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					mes.pfSaveFile = fopen(szSaveFilePath, "wb");
					if (mes.pfSaveFile == NULL) 
					{
						printf("Unable to create MES data file.\n");
						break;
					}
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			if (GetLatestDataMES(&mes, &distance) == EXIT_SUCCESS)
			{
				EnterCriticalSection(&StateVariablesCS);

				altitude_AGL = distance;

				LeaveCriticalSection(&StateVariablesCS);
			}
			else
			{
				printf("Connection to a MES lost.\n");
				bConnected = FALSE;
				DisconnectMES(&mes);
			}
		}

		//printf("MESThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	if (mes.pfSaveFile != NULL)
	{
		fclose(mes.pfSaveFile); 
		mes.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectMES(&mes);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}